

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_chain_methods<Gudhi::persistence_matrix::Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)8,false,false,false>>>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  Index IVar3;
  uint uVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_440;
  basic_cstring<const_char> local_430;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_420;
  assertion_result local_400;
  basic_cstring<const_char> local_3e8;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  basic_cstring<const_char> local_3b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3a8;
  assertion_result local_388;
  basic_cstring<const_char> local_370;
  basic_cstring<const_char> local_360;
  basic_cstring<const_char> local_350;
  basic_cstring<const_char> local_340;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_330;
  assertion_result local_310;
  basic_cstring<const_char> local_2f8;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2b8;
  assertion_result local_298;
  basic_cstring<const_char> local_280;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_240;
  assertion_result local_220;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1c8;
  assertion_result local_1a8;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_150;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  basic_cstring<const_char> local_e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_d8;
  assertion_result local_b8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90 [2];
  undefined1 local_70 [8];
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  col;
  Column_settings settings;
  
  Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings((Column_zp_settings *)&col.entryPool_,5);
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  ::Intrusive_set_column
            ((Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
              *)local_70,(Column_settings *)&col.entryPool_);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_90,0x3f4,&local_a0);
    bVar2 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
            ::is_paired((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                         *)(local_70 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_b8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e8,"!col.is_paired()",0x10);
    boost::unit_test::operator<<(&local_d8,plVar5,&local_e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_b8,&local_d8,&local_f8,0x3f4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_d8);
    boost::test_tools::assertion_result::~assertion_result(&local_b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_108,0x3f5,&local_118);
    IVar3 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
            ::get_paired_chain_index
                      ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                        *)(local_70 + 4));
    uVar4 = Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>
            ::get_null_value<unsigned_int>();
    boost::test_tools::assertion_result::assertion_result(&local_130,IVar3 == uVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
               ,0x61);
    boost::unit_test::operator<<(&local_150,plVar5,&local_160);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_130,&local_150,&local_170,0x3f5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_150);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  ::unassign_paired_chain
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
              *)(local_70 + 4));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_190);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_180,0x3f8,&local_190);
    bVar2 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
            ::is_paired((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                         *)(local_70 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_1a8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,"!col.is_paired()",0x10);
    boost::unit_test::operator<<(&local_1c8,plVar5,&local_1d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1a8,&local_1c8,&local_1e8,0x3f8,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1c8);
    boost::test_tools::assertion_result::~assertion_result(&local_1a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x3f9,&local_208);
    IVar3 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
            ::get_paired_chain_index
                      ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                        *)(local_70 + 4));
    uVar4 = Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>
            ::get_null_value<unsigned_int>();
    boost::test_tools::assertion_result::assertion_result(&local_220,IVar3 == uVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
               ,0x61);
    boost::unit_test::operator<<(&local_240,plVar5,&local_250);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_220,&local_240,&local_260,0x3f9,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_240);
    boost::test_tools::assertion_result::~assertion_result(&local_220);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  ::assign_paired_chain
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
              *)(local_70 + 4),2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_280);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_270,0x3fc,&local_280);
    bVar2 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
            ::is_paired((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                         *)(local_70 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_298,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,"col.is_paired()",0xf);
    boost::unit_test::operator<<(&local_2b8,plVar5,&local_2c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_298,&local_2b8,&local_2d8,0x3fc,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2b8);
    boost::test_tools::assertion_result::~assertion_result(&local_298);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2e8,0x3fd,&local_2f8);
    IVar3 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
            ::get_paired_chain_index
                      ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                        *)(local_70 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_310,IVar3 == 2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,"col.get_paired_chain_index() == 2",0x21);
    boost::unit_test::operator<<(&local_330,plVar5,&local_340);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_350,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_310,&local_330,&local_350,0x3fd,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_330);
    boost::test_tools::assertion_result::~assertion_result(&local_310);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  ::unassign_paired_chain
            ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
              *)(local_70 + 4));
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_370);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_360,0x400,&local_370);
    bVar2 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
            ::is_paired((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                         *)(local_70 + 4));
    boost::test_tools::assertion_result::assertion_result(&local_388,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b8,"!col.is_paired()",0x10);
    boost::unit_test::operator<<(&local_3a8,plVar5,&local_3b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_388,&local_3a8,&local_3c8,0x400,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3a8);
    boost::test_tools::assertion_result::~assertion_result(&local_388);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3d8,0x401,&local_3e8);
    IVar3 = Gudhi::persistence_matrix::
            Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
            ::get_paired_chain_index
                      ((Chain_column_extra_properties<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
                        *)(local_70 + 4));
    uVar4 = Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>
            ::get_null_value<unsigned_int>();
    boost::test_tools::assertion_result::assertion_result(&local_400,IVar3 == uVar4);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_430,
               "col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>()"
               ,0x61);
    boost::unit_test::operator<<(&local_420,plVar5,&local_430);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_400,&local_420,&local_440,0x401,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_420);
    boost::test_tools::assertion_result::~assertion_result(&local_400);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
  ::~Intrusive_set_column
            ((Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>_>
              *)local_70);
  Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_false,_false,_false>_>
  ::Column_zp_settings::~Column_zp_settings((Column_zp_settings *)&col.entryPool_);
  return;
}

Assistant:

void column_test_chain_methods() {
  typename Column::Column_settings settings(5);

  Column col(&settings);

  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());

  col.unassign_paired_chain();
  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());

  col.assign_paired_chain(2);
  BOOST_CHECK(col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == 2);

  col.unassign_paired_chain();
  BOOST_CHECK(!col.is_paired());
  BOOST_CHECK(col.get_paired_chain_index() == Column::Master::template get_null_value<typename Column::Index>());
}